

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O1

CURLcode Curl_rand_hex(Curl_easy *data,uchar *rnd,size_t num)

{
  byte bVar1;
  CURLcode CVar2;
  long lVar3;
  uchar *bufp;
  long lVar4;
  uchar buffer [128];
  byte local_98 [128];
  
  CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
  if ((num & 0xffffffffffffff01) == 1) {
    CVar2 = Curl_rand(data,local_98,num - 1 >> 1);
    if (CVar2 == CURLE_OK) {
      if (num - 1 != 0) {
        lVar3 = 0;
        lVar4 = 0;
        do {
          bVar1 = local_98[lVar4];
          rnd[lVar4 * 2] = "0123456789abcdef"[bVar1 >> 4];
          rnd[lVar4 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
          lVar4 = lVar4 + 1;
          lVar3 = lVar3 + -2;
        } while (1 - num != lVar3);
        rnd = rnd + -lVar3;
      }
      *rnd = '\0';
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_rand_hex(struct Curl_easy *data, unsigned char *rnd,
                       size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  const char *hex = "0123456789abcdef";
  unsigned char buffer[128];
  unsigned char *bufp = buffer;
  DEBUGASSERT(num > 1);

#ifdef __clang_analyzer__
  /* This silences a scan-build warning about accessing this buffer with
     uninitialized memory. */
  memset(buffer, 0, sizeof(buffer));
#endif

  if((num/2 >= sizeof(buffer)) || !(num&1))
    /* make sure it fits in the local buffer and that it is an odd number! */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  num--; /* save one for zero termination */

  result = Curl_rand(data, buffer, num/2);
  if(result)
    return result;

  while(num) {
    /* clang-tidy warns on this line without this comment: */
    /* NOLINTNEXTLINE(clang-analyzer-core.UndefinedBinaryOperatorResult) */
    *rnd++ = hex[(*bufp & 0xF0)>>4];
    *rnd++ = hex[*bufp & 0x0F];
    bufp++;
    num -= 2;
  }
  *rnd = 0;

  return result;
}